

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::CheckTypeIndex
          (Validator *this,Location *loc,Type actual,Type expected,char *desc,Index index,
          char *index_kind)

{
  char *pcVar1;
  char *pcVar2;
  Index index_local;
  char *desc_local;
  Type expected_local;
  Type actual_local;
  Location *loc_local;
  Validator *this_local;
  
  if (((expected != actual) && (expected != Any)) && (actual != Any)) {
    pcVar1 = GetTypeName(actual);
    pcVar2 = GetTypeName(expected);
    PrintError(this,loc,"type mismatch for %s %u of %s. got %s, expected %s",index_kind,(ulong)index
               ,desc,pcVar1,pcVar2);
  }
  return;
}

Assistant:

void Validator::CheckTypeIndex(const Location* loc,
                               Type actual,
                               Type expected,
                               const char* desc,
                               Index index,
                               const char* index_kind) {
  if (expected != actual && expected != Type::Any && actual != Type::Any) {
    PrintError(
        loc, "type mismatch for %s %" PRIindex " of %s. got %s, expected %s",
        index_kind, index, desc, GetTypeName(actual), GetTypeName(expected));
  }
}